

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalMapping::set_strvalue(CategoricalMapping *this,string *value)

{
  bool bVar1;
  string *psVar2;
  string *value_local;
  CategoricalMapping *this_local;
  
  bVar1 = has_strvalue(this);
  if (!bVar1) {
    clear_ValueOnUnknown(this);
    set_has_strvalue(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->ValueOnUnknown_).strvalue_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->ValueOnUnknown_).strvalue_,psVar2,value);
  return;
}

Assistant:

inline void CategoricalMapping::set_strvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.CategoricalMapping.strValue)
  if (!has_strvalue()) {
    clear_ValueOnUnknown();
    set_has_strvalue();
    ValueOnUnknown_.strvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  ValueOnUnknown_.strvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.CategoricalMapping.strValue)
}